

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::ArgMaxNullFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  AggregateFunctionSet *fun;
  AggregateFunctionSet *in_stack_00000170;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  AddArgMinMaxFunctions<duckdb::GreaterThan,false,(duckdb::OrderType)3>(in_stack_00000170);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMaxNullFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<GreaterThan, false, OrderType::DESCENDING>(fun);
	return fun;
}